

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int fix_unset_addr_list(UnsetAddrList *uslist,regex_t *reg)

{
  AbsAddrType *paddr;
  AbsAddrType addr;
  BagNode *en;
  int offset;
  int i;
  regex_t *reg_local;
  UnsetAddrList *uslist_local;
  
  en._4_4_ = 0;
  do {
    if (uslist->num <= en._4_4_) {
      return 0;
    }
    if ((((uslist->us[en._4_4_].target)->u).base.status & 0x100U) == 0) {
      if ((((uslist->us[en._4_4_].target)->u).base.status & 0x80U) != 0) {
        return -0xb;
      }
    }
    else {
      *(Bits *)((long)&reg->ops->opaddr + (long)uslist->us[en._4_4_].offset) =
           ((uslist->us[en._4_4_].target)->u).cclass.bs[4];
    }
    en._4_4_ = en._4_4_ + 1;
  } while( true );
}

Assistant:

static int
fix_unset_addr_list(UnsetAddrList* uslist, regex_t* reg)
{
  int i, offset;
  BagNode* en;
  AbsAddrType addr;
  AbsAddrType* paddr;

  for (i = 0; i < uslist->num; i++) {
    if (! ND_IS_FIXED_ADDR(uslist->us[i].target)) {
      if (ND_IS_CALLED(uslist->us[i].target))
        return ONIGERR_PARSER_BUG;
      else {
        /* CASE: called node doesn't have called address.
           ex. /((|a\g<1>)(.){0}){0}\g<3>/
           group-1 doesn't called, but compiled into bytecodes,
           because group-3 is referred from outside.
        */
        continue;
      }
    }

    en = BAG_(uslist->us[i].target);
    addr   = en->m.called_addr;
    offset = uslist->us[i].offset;

    paddr = (AbsAddrType* )((char* )reg->ops + offset);
    *paddr = addr;
  }
  return 0;
}